

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  ulong uVar1;
  ulong uVar2;
  ulong a;
  int iVar3;
  int iVar4;
  int64_t b;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  uint64_t uVar8;
  ulong uVar9;
  long in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  secp256k1_int128 ce;
  secp256k1_int128 cd;
  int64_t se;
  int64_t sd;
  int64_t me;
  int64_t md;
  int64_t r;
  int64_t q;
  int64_t v;
  int64_t u;
  int64_t e4;
  int64_t e3;
  int64_t e2;
  int64_t e1;
  int64_t e0;
  int64_t d4;
  int64_t d3;
  int64_t d2;
  int64_t d1;
  int64_t d0;
  uint64_t M62;
  int64_t in_stack_ffffffffffffff08;
  long lVar10;
  uint n;
  secp256k1_int128 *r_00;
  int64_t in_stack_ffffffffffffff28;
  secp256k1_int128 *in_stack_ffffffffffffff30;
  secp256k1_int128 local_c8;
  ulong local_b8;
  ulong local_b0;
  long local_a8;
  int64_t in_stack_ffffffffffffff60;
  secp256k1_modinv64_signed62 *b_00;
  ulong a_00;
  secp256k1_modinv64_signed62 *a_01;
  
  uVar9 = *in_RDI;
  uVar1 = in_RDI[4];
  uVar2 = in_RSI[4];
  a = *in_RDX;
  a_01 = (secp256k1_modinv64_signed62 *)in_RDX[1];
  a_00 = in_RDX[2];
  b_00 = (secp256k1_modinv64_signed62 *)in_RDX[3];
  iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,(int)(a_00 >> 0x20),b_00,in_stack_ffffffffffffff60);
  if (iVar3 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1a2,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,(int)(a_00 >> 0x20),b_00,in_stack_ffffffffffffff60);
  if (-1 < iVar3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1a3,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0");
    abort();
  }
  iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,(int)(a_00 >> 0x20),b_00,in_stack_ffffffffffffff60);
  if (iVar3 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1a4,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,(int)(a_00 >> 0x20),b_00,in_stack_ffffffffffffff60);
  if (-1 < iVar3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1a5,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0");
    abort();
  }
  b = secp256k1_modinv64_abs(in_stack_ffffffffffffff08);
  iVar5 = secp256k1_modinv64_abs(in_stack_ffffffffffffff08);
  if (0x4000000000000000 - iVar5 < b) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1a6,
            "test condition failed: secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))"
           );
    abort();
  }
  iVar5 = secp256k1_modinv64_abs(in_stack_ffffffffffffff08);
  iVar6 = secp256k1_modinv64_abs(in_stack_ffffffffffffff08);
  if (0x4000000000000000 - iVar6 < iVar5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1a7,
            "test condition failed: secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))"
           );
    abort();
  }
  local_b0 = (long)uVar1 >> 0x3f;
  local_b8 = (long)uVar2 >> 0x3f;
  lVar7 = (a & local_b0) + ((ulong)a_01 & local_b8);
  local_a8 = (a_00 & local_b0) + ((ulong)b_00 & local_b8);
  secp256k1_i128_mul(&local_c8,a,uVar9);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_mul((secp256k1_int128 *)&stack0xffffffffffffff28,a_00,uVar9);
  iVar3 = (int)(a_00 >> 0x20);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  lVar10 = *(long *)(in_RCX + 0x28);
  uVar8 = secp256k1_i128_to_u64(&local_c8);
  lVar7 = lVar7 - (lVar10 * uVar8 + lVar7 & 0x3fffffffffffffff);
  r_00 = *(secp256k1_int128 **)(in_RCX + 0x28);
  uVar8 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff28);
  n = (uint)((ulong)lVar10 >> 0x20);
  local_a8 = local_a8 - ((long)r_00 * uVar8 + local_a8 & 0x3fffffffffffffff);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  uVar8 = secp256k1_i128_to_u64(&local_c8);
  if ((uVar8 & 0x3fffffffffffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1ba,"test condition failed: (secp256k1_i128_to_u64(&cd) & M62) == 0");
    abort();
  }
  secp256k1_i128_rshift(r_00,n);
  uVar8 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff28);
  if ((uVar8 & 0x3fffffffffffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1bb,"test condition failed: (secp256k1_i128_to_u64(&ce) & M62) == 0");
    abort();
  }
  secp256k1_i128_rshift(r_00,n);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  if (*(long *)(in_RCX + 8) != 0) {
    secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
    secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  }
  uVar8 = secp256k1_i128_to_u64(&local_c8);
  *in_RDI = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  uVar8 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff28);
  *in_RSI = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  if (*(long *)(in_RCX + 0x10) != 0) {
    secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
    secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  }
  uVar8 = secp256k1_i128_to_u64(&local_c8);
  in_RDI[1] = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  uVar8 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff28);
  in_RSI[1] = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  if (*(long *)(in_RCX + 0x18) != 0) {
    secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
    secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  }
  uVar8 = secp256k1_i128_to_u64(&local_c8);
  in_RDI[2] = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  uVar8 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff28);
  in_RSI[2] = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  secp256k1_i128_accum_mul(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,b);
  uVar8 = secp256k1_i128_to_u64(&local_c8);
  in_RDI[3] = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  uVar8 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff28);
  in_RSI[3] = uVar8 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(r_00,n);
  uVar9 = secp256k1_i128_to_i64(r_00);
  in_RDI[4] = uVar9;
  uVar9 = secp256k1_i128_to_i64(r_00);
  in_RSI[4] = uVar9;
  iVar4 = secp256k1_modinv64_mul_cmp_62(a_01,iVar3,b_00,lVar7);
  if (iVar4 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1ea,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar4 = secp256k1_modinv64_mul_cmp_62(a_01,iVar3,b_00,lVar7);
  if (-1 < iVar4) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1eb,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0");
    abort();
  }
  iVar4 = secp256k1_modinv64_mul_cmp_62(a_01,iVar3,b_00,lVar7);
  if (iVar4 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1ec,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,iVar3,b_00,lVar7);
  if (-1 < iVar3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x1ed,
            "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0");
    abort();
  }
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}